

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_SetRoll(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                       VMReturn *ret,int numret)

{
  void *pvVar1;
  bool bVar2;
  AActor *pAVar3;
  char *pcVar4;
  uint uVar5;
  DAngle local_30;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003e8b9b;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e8b8b:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e8b9b:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x128d,
                  "int AF_AActor_A_SetRoll(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAVar3 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar3 == (AActor *)0x0) goto LAB_003e8ae2;
    bVar2 = DObject::IsKindOf((DObject *)pAVar3,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e8b9b;
    }
  }
  else {
    if (pAVar3 != (AActor *)0x0) goto LAB_003e8b8b;
LAB_003e8ae2:
    pAVar3 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
LAB_003e8bc3:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x128e,
                  "int AF_AActor_A_SetRoll(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\x01') {
    pcVar4 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_003e8bc3;
  }
  pvVar1 = param[1].field_0.field_1.a;
  if ((uint)numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003e8beb;
    }
    uVar5 = param[2].field_0.i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
LAB_003e8beb:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x128f,
                    "int AF_AActor_A_SetRoll(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    uVar5 = param[2].field_0.i;
    if (numparam != 3) {
      if (param[3].field_0.field_3.Type == '\0') goto LAB_003e8b4c;
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003e8c0a;
    }
    param = defaultparam->Array;
  }
  if (param[3].field_0.field_3.Type == '\0') {
LAB_003e8b4c:
    pAVar3 = COPY_AAPTR(pAVar3,param[3].field_0.i);
    if (pAVar3 != (AActor *)0x0) {
      local_30.Degrees = (double)pvVar1;
      AActor::SetRoll(pAVar3,&local_30,SUB41((uVar5 & 2) >> 1,0));
    }
    return 0;
  }
  pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003e8c0a:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1290,
                "int AF_AActor_A_SetRoll(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetRoll)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT		(roll);
	PARAM_INT_DEF	(flags);
	PARAM_INT_DEF	(ptr)	;
	AActor *ref = COPY_AAPTR(self, ptr);

	if (ref != NULL)
	{
		ref->SetRoll(roll, !!(flags & SPF_INTERPOLATE));
	}
	return 0;
}